

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

void duckdb::Leaf::InsertIntoInlined
               (ART *art,Node *node,ARTKey *row_id,idx_t depth,GateStatus status)

{
  uint8_t byte;
  ulong uVar1;
  reference<Node> node_00;
  Allocator *allocator_00;
  idx_t iVar2;
  GateStatus status_00;
  IndexPointer child;
  ulong *puVar3;
  ulong uVar4;
  reference<Node> next;
  ARTKey key;
  ArenaAllocator allocator;
  
  allocator_00 = Allocator::Get((art->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&allocator,allocator_00,0x800);
  key = ARTKey::CreateARTKey<long>(&allocator,(node->super_IndexPointer).data & 0xffffffffffffff);
  puVar3 = (ulong *)key.data;
  iVar2 = (node->super_IndexPointer).data;
  status_00 = (GateStatus)(iVar2 >> 0x3f);
  if ((long)iVar2 < 0) {
    depth = 0;
  }
  if (status == GATE_NOT_SET) {
    depth = 0;
    status_00 = GATE_SET;
  }
  (node->super_IndexPointer).data = 0;
  iVar2 = ARTKey::GetMismatchPos(row_id,&key,depth);
  byte = row_id->data[iVar2];
  next._M_data = node;
  if (iVar2 - depth != 0) {
    Prefix::New(art,&next,row_id,depth,iVar2 - depth);
  }
  node_00._M_data = next._M_data;
  if (iVar2 == 7) {
    BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(art,next._M_data);
  }
  else {
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,next._M_data);
  }
  if (iVar2 == 7) {
    child.data = 0;
  }
  else {
    uVar1 = *puVar3;
    uVar4 = uVar1 & 0xfffffffffffffff8 ^ 0x87;
    child.data = uVar1 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                 (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                 (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 |
                 uVar4 << 0x38;
  }
  uVar1 = *(ulong *)row_id->data;
  Node::InsertChild(art,node_00._M_data,*(uint8_t *)((long)puVar3 + iVar2),(Node)child.data);
  uVar4 = uVar1 & 0xfffffffffffffff8 ^ 0x87;
  Node::InsertChild(art,node_00._M_data,byte,
                    (Node)(uVar1 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                           (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                           (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
                           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38));
  Node::SetGateStatus(node,status_00);
  ArenaAllocator::~ArenaAllocator(&allocator);
  return;
}

Assistant:

void Leaf::InsertIntoInlined(ART &art, Node &node, const ARTKey &row_id, idx_t depth, const GateStatus status) {
	D_ASSERT(node.GetType() == INLINED);

	ArenaAllocator allocator(Allocator::Get(art.db));
	auto key = ARTKey::CreateARTKey<row_t>(allocator, node.GetRowId());

	GateStatus new_status;
	if (status == GateStatus::GATE_NOT_SET || node.GetGateStatus() == GateStatus::GATE_SET) {
		new_status = GateStatus::GATE_SET;
	} else {
		new_status = GateStatus::GATE_NOT_SET;
	}

	if (new_status == GateStatus::GATE_SET) {
		depth = 0;
	}
	node.Clear();

	// Get the mismatching position.
	D_ASSERT(row_id.len == key.len);
	auto pos = row_id.GetMismatchPos(key, depth);
	D_ASSERT(pos != DConstants::INVALID_INDEX);
	D_ASSERT(pos >= depth);
	auto byte = row_id.data[pos];

	// Create the (optional) prefix and the node.
	reference<Node> next(node);
	auto count = pos - depth;
	if (count != 0) {
		Prefix::New(art, next, row_id, depth, count);
	}
	if (pos == Prefix::ROW_ID_COUNT) {
		Node7Leaf::New(art, next);
	} else {
		Node4::New(art, next);
	}

	// Create the children.
	Node row_id_node;
	Leaf::New(row_id_node, row_id.GetRowId());
	Node remainder;
	if (pos != Prefix::ROW_ID_COUNT) {
		Leaf::New(remainder, key.GetRowId());
	}

	Node::InsertChild(art, next, key[pos], remainder);
	Node::InsertChild(art, next, byte, row_id_node);
	node.SetGateStatus(new_status);
}